

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9d_parser2_syntax.c
# Opt level: O1

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)

{
  RK_U8 (*paRVar1) [9];
  DXVA_PicEntry_VPx DVar2;
  void *pvVar3;
  ushort uVar4;
  UCHAR UVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  RK_U32 RVar9;
  byte *pbVar10;
  byte bVar11;
  byte bVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  RK_U8 (*paaRVar19) [4] [3];
  undefined8 *puVar20;
  UCHAR (*paUVar21) [9];
  int iVar22;
  RK_U8 (*paRVar23) [9];
  UCHAR (*paUVar24) [9];
  long lVar25;
  bool bVar26;
  byte bVar27;
  RK_U8 partition_probs_delata [16] [3];
  RK_U8 partition_probs_flag [16] [3];
  RK_U8 partition_probs [16] [3];
  RK_U8 uv_mode_prob [10] [9];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  UCHAR aUStack_80 [80];
  undefined2 local_30;
  
  bVar27 = 0;
  pvVar3 = ctx->priv_data;
  (ctx->pic_params).profile = (UCHAR)ctx->profile;
  uVar8 = (ctx->pic_params).field_2.wFormatAndPictureInfoFlags;
  uVar13 = (*(byte *)((long)pvVar3 + 0xd0) & 1) << 0xe;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8 & 0xbfff | uVar13;
  bVar26 = *(char *)((long)pvVar3 + 0xd1) == '\0';
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8 & 0xbffe | uVar13 | (ushort)bVar26;
  uVar8 = (uVar8 & 0xbffc | uVar13 | (ushort)bVar26) +
          (ushort)(*(char *)((long)pvVar3 + 0xd7) == '\0') * 2;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8;
  uVar8 = (uVar8 & 0xfffb) + (*(byte *)((long)pvVar3 + 0xd9) & 1) * 4;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8;
  uVar8 = (uVar8 & 0xfff7) + (*(byte *)((long)pvVar3 + 0xda) & 1) * 8;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8;
  uVar14 = (*(byte *)((long)pvVar3 + 0xdb) & 1) << 4;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8 & 0xffef | uVar14;
  uVar13 = (ushort)((*(uint *)((long)pvVar3 + 0xdc) & 1) << 5);
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8 & 0xffcf | uVar14 | uVar13;
  uVar15 = (*(byte *)((long)pvVar3 + 0xea) & 1) << 6;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags = uVar8 & 0xff8f | uVar14 | uVar13 | uVar15;
  bVar11 = *(char *)((long)pvVar3 + 0xdd) << 7;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar8 & 0xff0f | uVar14 | uVar13 | uVar15 | (ushort)bVar11;
  uVar16 = (*(byte *)((long)pvVar3 + 0xec) & 3) << 8;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar8 & 0xfc0f | uVar14 | uVar13 | uVar15 | (ushort)bVar11 | uVar16;
  uVar17 = (*(byte *)((long)pvVar3 + 0xde) & 3) << 10;
  uVar4 = (ushort)bVar11;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar8 & 0xf00f | uVar14 | uVar13 | uVar15 | uVar4 | uVar16 | uVar17;
  uVar18 = (*(byte *)((long)pvVar3 + 0xe0) & 1) << 0xc;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar8 & 0xe00f | uVar14 | uVar13 | uVar15 | uVar4 | uVar16 | uVar17 | uVar18;
  (ctx->pic_params).field_2.wFormatAndPictureInfoFlags =
       uVar8 & 0xc00f | uVar14 | uVar13 | uVar15 | uVar4 | uVar16 | uVar17 | uVar18 |
       (*(byte *)((long)pvVar3 + 0xeb) & 1) << 0xd;
  (ctx->pic_params).width = ctx->width;
  (ctx->pic_params).height = ctx->height;
  UVar5 = *(char *)((long)pvVar3 + 0xd4) + 0xf8;
  (ctx->pic_params).BitDepthMinus8Luma = UVar5;
  (ctx->pic_params).BitDepthMinus8Chroma = UVar5;
  (ctx->pic_params).interp_filter = *(UCHAR *)((long)pvVar3 + 0xe4);
  (ctx->pic_params).CurrPic.field_0.bPicEntry =
       (ctx->pic_params).CurrPic.field_0.bPicEntry & 0x80 | *(byte *)((long)pvVar3 + 0x100) & 0x7f;
  puVar20 = (undefined8 *)((long)pvVar3 + 0x140);
  lVar25 = 0;
  do {
    (ctx->pic_params).ref_frame_map[lVar25].field_0 =
         (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
         ((ctx->pic_params).ref_frame_map[lVar25].field_0.bPicEntry & 0x80 |
         *(byte *)(puVar20 + 1) & 0x7f);
    RVar9 = mpp_frame_get_width((MppFrame)*puVar20);
    (ctx->pic_params).ref_frame_coded_width[lVar25] = RVar9;
    RVar9 = mpp_frame_get_height((MppFrame)*puVar20);
    (ctx->pic_params).ref_frame_coded_height[lVar25] = RVar9;
    lVar25 = lVar25 + 1;
    puVar20 = puVar20 + 3;
  } while (lVar25 != 8);
  DVar2.field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       (ctx->pic_params).frame_refs[1].field_0.bPicEntry;
  (ctx->pic_params).frame_refs[0].field_0.bPicEntry =
       (ctx->pic_params).frame_refs[0].field_0.bPicEntry & 0x80 |
       *(byte *)((long)pvVar3 + 0xed) & 0x7f;
  (ctx->pic_params).frame_refs[1].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       ((byte)DVar2.field_0 & 0x80 | *(byte *)((long)pvVar3 + 0xee) & 0x7f);
  (ctx->pic_params).frame_refs[2].field_0 =
       (anon_union_1_2_6b1cbba2_for__DXVA_PicEntry_VPx_0)
       ((ctx->pic_params).frame_refs[2].field_0.bPicEntry & 0x80 |
       *(byte *)((long)pvVar3 + 0xef) & 0x7f);
  (ctx->pic_params).ref_frame_sign_bias[1] = *(CHAR *)((long)pvVar3 + 0xf0);
  (ctx->pic_params).ref_frame_sign_bias[2] = *(CHAR *)((long)pvVar3 + 0xf1);
  (ctx->pic_params).ref_frame_sign_bias[3] = *(CHAR *)((long)pvVar3 + 0xf2);
  (ctx->pic_params).filter_level = *(CHAR *)((long)pvVar3 + 0x204);
  (ctx->pic_params).sharpness_level = *(CHAR *)((long)pvVar3 + 0x205);
  bVar11 = (ctx->pic_params).field_16.wControlInfoFlags;
  bVar6 = *(byte *)((long)pvVar3 + 0x286) & 1;
  (ctx->pic_params).field_16.wControlInfoFlags = bVar11 & 0xfe | bVar6;
  bVar7 = *(char *)((long)pvVar3 + 0x287) * '\x02' & 2;
  (ctx->pic_params).field_16.wControlInfoFlags = bVar11 & 0xfc | bVar6 | bVar7;
  (ctx->pic_params).field_16.wControlInfoFlags =
       bVar11 & 0xf8 | bVar6 | bVar7 | (*(byte *)((long)pvVar3 + 0xd8) & 1) << 2;
  (ctx->pic_params).ref_deltas[0] = *(CHAR *)((long)pvVar3 + 0x28a);
  (ctx->pic_params).ref_deltas[1] = *(CHAR *)((long)pvVar3 + 0x28b);
  (ctx->pic_params).ref_deltas[2] = *(CHAR *)((long)pvVar3 + 0x28c);
  (ctx->pic_params).ref_deltas[3] = *(CHAR *)((long)pvVar3 + 0x28d);
  (ctx->pic_params).mode_deltas[0] = *(CHAR *)((long)pvVar3 + 0x288);
  (ctx->pic_params).mode_deltas[1] = *(CHAR *)((long)pvVar3 + 0x289);
  (ctx->pic_params).base_qindex = (ushort)*(byte *)((long)pvVar3 + 0x28e);
  (ctx->pic_params).y_dc_delta_q = *(CHAR *)((long)pvVar3 + 0x28f);
  (ctx->pic_params).uv_dc_delta_q = *(CHAR *)((long)pvVar3 + 0x290);
  (ctx->pic_params).uv_ac_delta_q = *(CHAR *)((long)pvVar3 + 0x291);
  (ctx->pic_params).txmode = *(CHAR *)((long)pvVar3 + 0x6f10);
  (ctx->pic_params).refmode = *(CHAR *)((long)pvVar3 + 0x6f14);
  bVar11 = (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags;
  bVar6 = *(byte *)((long)pvVar3 + 0x294) & 1;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar11 & 0xfe | bVar6;
  bVar7 = *(char *)((long)pvVar3 + 0x297) * '\x02' & 2;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar11 & 0xfc | bVar6 | bVar7;
  bVar12 = (*(byte *)((long)pvVar3 + 0x295) & 1) << 2;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags = bVar11 & 0xf8 | bVar6 | bVar7 | bVar12
  ;
  (ctx->pic_params).stVP9Segments.field_0.wSegmentInfoFlags =
       (*(byte *)((long)pvVar3 + 0x296) & 1) << 3 | bVar6 | bVar7 | bVar12;
  lVar25 = 0;
  do {
    (ctx->pic_params).stVP9Segments.tree_probs[lVar25] = *(UCHAR *)((long)pvVar3 + lVar25 + 0x2b6f);
    lVar25 = lVar25 + 1;
  } while (lVar25 != 7);
  (ctx->pic_params).stVP9Segments.pred_probs[0] = *(UCHAR *)((long)pvVar3 + 0x2b76);
  (ctx->pic_params).stVP9Segments.pred_probs[1] = *(UCHAR *)((long)pvVar3 + 0x2b77);
  (ctx->pic_params).stVP9Segments.pred_probs[2] = *(UCHAR *)((long)pvVar3 + 0x2b78);
  pbVar10 = (byte *)((long)pvVar3 + 0x29a);
  lVar25 = -8;
  do {
    *(undefined2 *)((ctx->pic_params).stVP9Segments.feature_mask + lVar25 * 8) =
         *(undefined2 *)(pbVar10 + 6);
    *(short *)((long)((ctx->pic_params).prob.y_mode + -3) + 7 + lVar25 * 8) =
         (short)(char)pbVar10[8];
    *(ushort *)((long)((ctx->pic_params).prob.y_mode + -2) + lVar25 * 8) = (ushort)pbVar10[4];
    bVar11 = pbVar10[3];
    *(ushort *)((long)((ctx->pic_params).prob.y_mode + -2) + 2 + lVar25 * 8) = (ushort)bVar11;
    *(byte *)((long)((ctx->pic_params).prob.y_mode + -2) + 4 + lVar25) =
         bVar11 * '\b' | *pbVar10 | pbVar10[2] << 2 | pbVar10[1] * '\x02';
    pbVar10 = pbVar10 + 0x1a;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0);
  (ctx->pic_params).log2_tile_cols = *(UCHAR *)((long)pvVar3 + 0x36c);
  (ctx->pic_params).log2_tile_rows = *(UCHAR *)((long)pvVar3 + 0x370);
  (ctx->pic_params).first_partition_size = *(USHORT *)((long)pvVar3 + 0x70a0);
  (ctx->pic_params).uncompressed_header_size_byte_aligned = *(USHORT *)((long)pvVar3 + 0x709c);
  *(undefined8 *)(ctx->pic_params).mvscale = *(undefined8 *)((long)pvVar3 + 0x7088);
  (ctx->pic_params).mvscale[2] = *(USHORT (*) [2])((long)pvVar3 + 0x7090);
  memcpy(&(ctx->pic_params).prob,(void *)((long)pvVar3 + 0x2378),0x7f7);
  memcpy(&(ctx->pic_params).prob_flag_delta,(void *)((long)pvVar3 + 0x2b79),0xfee);
  paaRVar19 = (ctx->pic_params).prob_flag_delta.p_delta.partition + 3;
  lVar25 = 0;
  do {
    *(undefined4 *)((long)&uStack_b0 + lVar25) = *(undefined4 *)((long)(paaRVar19 + -0x512) + 9);
    *(undefined8 *)((long)&local_b8 + lVar25) = *(undefined8 *)((long)(paaRVar19 + -0x512) + 1);
    *(undefined8 *)((long)&local_e8 + lVar25) = *(undefined8 *)((long)(paaRVar19 + -0x1a) + 1);
    *(undefined4 *)((long)&uStack_e0 + lVar25) = *(undefined4 *)((long)(paaRVar19 + -0x1a) + 9);
    *(undefined8 *)((long)&local_118 + lVar25) = *(undefined8 *)*paaRVar19;
    *(undefined4 *)((long)&uStack_110 + lVar25) = *(undefined4 *)((*paaRVar19)[2] + 2);
    lVar25 = lVar25 + 0xc;
    paaRVar19 = paaRVar19 + -1;
  } while (lVar25 != 0x30);
  *(undefined8 *)((ctx->pic_params).prob.partition[2][2] + 2) = local_98;
  *(undefined8 *)((ctx->pic_params).prob.partition[3][1] + 1) = uStack_90;
  *(undefined8 *)((ctx->pic_params).prob.partition[1][1] + 1) = local_a8;
  *(undefined8 *)(ctx->pic_params).prob.partition[2] = uStack_a0;
  *(undefined8 *)(ctx->pic_params).prob.partition[0] = local_b8;
  *(undefined8 *)((ctx->pic_params).prob.partition[0][2] + 2) = uStack_b0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[2][2] + 2) = local_c8;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[3][1] + 1) = uStack_c0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[1][1] + 1) = local_d8;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_flag.partition[2] = uStack_d0;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_flag.partition[0] = local_e8;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_flag.partition[0][2] + 2) = uStack_e0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[2][2] + 2) = local_f8;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[3][1] + 1) = uStack_f0;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[1][1] + 1) = local_108;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_delta.partition[2] = uStack_100;
  *(undefined8 *)(ctx->pic_params).prob_flag_delta.p_delta.partition[0] = local_118;
  *(undefined8 *)((ctx->pic_params).prob_flag_delta.p_delta.partition[0][2] + 2) = uStack_110;
  paUVar21 = (ctx->pic_params).prob.uv_mode;
  iVar22 = 0;
  lVar25 = 0;
  do {
    paUVar24 = (ctx->pic_params).prob.uv_mode + 2;
    switch(iVar22) {
    case 0:
      break;
    case 1:
      paUVar24 = paUVar21;
      break;
    case 2:
      paUVar24 = (ctx->pic_params).prob.uv_mode + 1;
      break;
    default:
      paUVar24 = (UCHAR (*) [9])(*paUVar21 + lVar25);
      break;
    case 7:
      paUVar24 = (ctx->pic_params).prob.uv_mode + 8;
      break;
    case 8:
      paUVar24 = (ctx->pic_params).prob.uv_mode + 7;
    }
    aUStack_80[lVar25] = (*paUVar24)[8];
    *(undefined8 *)((long)&local_88 + lVar25) = *(undefined8 *)*paUVar24;
    lVar25 = lVar25 + 9;
    iVar22 = iVar22 + 1;
  } while (lVar25 != 0x5a);
  puVar20 = &local_88;
  for (lVar25 = 0x16; lVar25 != 0; lVar25 = lVar25 + -1) {
    *(undefined4 *)*paUVar21 = *(undefined4 *)puVar20;
    puVar20 = (undefined8 *)((long)puVar20 + ((ulong)bVar27 * -2 + 1) * 4);
    paUVar21 = (UCHAR (*) [9])((long)paUVar21 + (ulong)bVar27 * -8 + 4);
  }
  *(undefined2 *)((ctx->pic_params).prob.uv_mode[9] + 7) = local_30;
  paRVar1 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode;
  iVar22 = 0;
  lVar25 = 0;
  do {
    paRVar23 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 2;
    switch(iVar22) {
    case 0:
      break;
    case 1:
      paRVar23 = paRVar1;
      break;
    case 2:
      paRVar23 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 1;
      break;
    default:
      paRVar23 = (RK_U8 (*) [9])(*paRVar1 + lVar25);
      break;
    case 7:
      paRVar23 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 8;
      break;
    case 8:
      paRVar23 = (ctx->pic_params).prob_flag_delta.p_flag.uv_mode + 7;
    }
    aUStack_80[lVar25] = (*paRVar23)[8];
    *(undefined8 *)((long)&local_88 + lVar25) = *(undefined8 *)*paRVar23;
    lVar25 = lVar25 + 9;
    iVar22 = iVar22 + 1;
  } while (lVar25 != 0x5a);
  memcpy(paRVar1,&local_88,0x5a);
  paRVar1 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode;
  iVar22 = 0;
  lVar25 = 0;
  do {
    paRVar23 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 2;
    switch(iVar22) {
    case 0:
      break;
    case 1:
      paRVar23 = paRVar1;
      break;
    case 2:
      paRVar23 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 1;
      break;
    default:
      paRVar23 = (RK_U8 (*) [9])(*paRVar1 + lVar25);
      break;
    case 7:
      paRVar23 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 8;
      break;
    case 8:
      paRVar23 = (ctx->pic_params).prob_flag_delta.p_delta.uv_mode + 7;
    }
    aUStack_80[lVar25] = (*paRVar23)[8];
    *(undefined8 *)((long)&local_88 + lVar25) = *(undefined8 *)*paRVar23;
    lVar25 = lVar25 + 9;
    iVar22 = iVar22 + 1;
  } while (lVar25 != 0x5a);
  memcpy(paRVar1,&local_88,0x5a);
  return 0;
}

Assistant:

RK_S32 vp9d_parser2_syntax(Vp9CodecContext *ctx)
{
    vp9d_fill_picparams(ctx, &ctx->pic_params);
    return 0;
}